

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O2

Load * __thiscall MixedArena::alloc<wasm::Load>(MixedArena *this)

{
  Load *pLVar1;
  
  pLVar1 = (Load *)allocSpace(this,0x48,8);
  (pLVar1->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression._id = LoadId;
  (pLVar1->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression.type.id = 0;
  pLVar1->signed_ = false;
  (pLVar1->memory).super_IString.str._M_len = 0;
  (pLVar1->memory).super_IString.str._M_str = (char *)0x0;
  (pLVar1->offset).addr = 0;
  (pLVar1->align).addr = 0;
  return pLVar1;
}

Assistant:

T* alloc() {
    static_assert(alignof(T) <= MAX_ALIGN,
                  "maximum alignment not large enough");
    auto* ret = static_cast<T*>(allocSpace(sizeof(T), alignof(T)));
    new (ret) T(*this); // allocated objects receive the allocator, so they can
                        // allocate more later if necessary
    return ret;
  }